

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O2

void QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(longlong i)

{
  ostream *poVar1;
  range_error *this;
  locale alStack_1b8 [8];
  string local_1b0 [32];
  ostringstream msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  std::locale::classic();
  std::ios::imbue(alStack_1b8);
  std::locale::~locale(alStack_1b8);
  poVar1 = std::operator<<((ostream *)&msg,"integer out of range converting ");
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  poVar1 = std::operator<<(poVar1," from a ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"-byte signed type to a ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"-byte unsigned type");
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::range_error::range_error(this,local_1b0);
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

static void
        error(From i)
        {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "integer out of range converting " << i << " from a " << sizeof(From)
                << "-byte signed type to a " << sizeof(To) << "-byte unsigned type";
            throw std::range_error(msg.str());
        }